

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RequiredFlags_Test::~TApp_RequiredFlags_Test(TApp_RequiredFlags_Test *this)

{
  TApp_RequiredFlags_Test *this_local;
  
  ~TApp_RequiredFlags_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RequiredFlags) {
    app.add_flag("-a")->required();
    app.add_flag("-b")->mandatory(); // Alternate term

    EXPECT_THROW(run(), CLI::RequiredError);

    app.reset();

    args = {"-a"};
    EXPECT_THROW(run(), CLI::RequiredError);

    app.reset();
    args = {"-b"};
    EXPECT_THROW(run(), CLI::RequiredError);

    app.reset();
    args = {"-a", "-b"};
    run();
}